

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall discordpp::Message::~Message(Message *this)

{
  _Head_base<0UL,_discordpp::RoleSubscriptionData_*,_false> __ptr_00;
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_discordpp::MessageInteraction_*,_false> __ptr_01;
  _Head_base<0UL,_discordpp::MessageReference_*,_false> __ptr_02;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var2;
  _Head_base<0UL,_discordpp::MessageActivity_*,_false> __ptr_03;
  _Head_base<0UL,_bool_*,_false> _Var3;
  _Head_base<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  __ptr_04;
  _Head_base<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_false>
  __ptr_05;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  _Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_> _Var5;
  pointer *__ptr;
  
  __ptr_00._M_head_impl =
       (this->role_subscription_data).super_field<discordpp::RoleSubscriptionData>.t_._M_t.
       super___uniq_ptr_impl<discordpp::RoleSubscriptionData,_std::default_delete<discordpp::RoleSubscriptionData>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::RoleSubscriptionData_*,_std::default_delete<discordpp::RoleSubscriptionData>_>
       .super__Head_base<0UL,_discordpp::RoleSubscriptionData_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (RoleSubscriptionData *)0x0) {
    std::default_delete<discordpp::RoleSubscriptionData>::operator()
              ((default_delete<discordpp::RoleSubscriptionData> *)
               &(this->role_subscription_data).super_field<discordpp::RoleSubscriptionData>,
               __ptr_00._M_head_impl);
  }
  (this->role_subscription_data).super_field<discordpp::RoleSubscriptionData>.t_._M_t.
  super___uniq_ptr_impl<discordpp::RoleSubscriptionData,_std::default_delete<discordpp::RoleSubscriptionData>_>
  ._M_t.
  super__Tuple_impl<0UL,_discordpp::RoleSubscriptionData_*,_std::default_delete<discordpp::RoleSubscriptionData>_>
  .super__Head_base<0UL,_discordpp::RoleSubscriptionData_*,_false>._M_head_impl =
       (RoleSubscriptionData *)0x0;
  _Var1._M_head_impl =
       (this->position).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl != (int *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  (this->position).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  std::
  unique_ptr<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  ::~unique_ptr(&(this->stickers).
                 super_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>.
                 t_);
  std::
  unique_ptr<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>,_std::default_delete<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>_>
  ::~unique_ptr(&(this->sticker_items).
                 super_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
  ::~unique_ptr(&(this->components).
                 super_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>
                 .t_);
  std::unique_ptr<discordpp::Channel,_std::default_delete<discordpp::Channel>_>::~unique_ptr
            (&(this->thread).super_field<discordpp::Channel>.t_);
  __ptr_01._M_head_impl =
       (this->interaction).super_field<discordpp::MessageInteraction>.t_._M_t.
       super___uniq_ptr_impl<discordpp::MessageInteraction,_std::default_delete<discordpp::MessageInteraction>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::MessageInteraction_*,_std::default_delete<discordpp::MessageInteraction>_>
       .super__Head_base<0UL,_discordpp::MessageInteraction_*,_false>._M_head_impl;
  if (__ptr_01._M_head_impl != (MessageInteraction *)0x0) {
    std::default_delete<discordpp::MessageInteraction>::operator()
              ((default_delete<discordpp::MessageInteraction> *)
               &(this->interaction).super_field<discordpp::MessageInteraction>,__ptr_01._M_head_impl
              );
  }
  (this->interaction).super_field<discordpp::MessageInteraction>.t_._M_t.
  super___uniq_ptr_impl<discordpp::MessageInteraction,_std::default_delete<discordpp::MessageInteraction>_>
  ._M_t.
  super__Tuple_impl<0UL,_discordpp::MessageInteraction_*,_std::default_delete<discordpp::MessageInteraction>_>
  .super__Head_base<0UL,_discordpp::MessageInteraction_*,_false>._M_head_impl =
       (MessageInteraction *)0x0;
  std::unique_ptr<discordpp::Message,_std::default_delete<discordpp::Message>_>::~unique_ptr
            (&(this->referenced_message).super_field<discordpp::Message>.t_);
  _Var1._M_head_impl =
       (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (int *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  __ptr_02._M_head_impl =
       (this->message_reference).super_field<discordpp::MessageReference>.t_._M_t.
       super___uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::MessageReference_*,_std::default_delete<discordpp::MessageReference>_>
       .super__Head_base<0UL,_discordpp::MessageReference_*,_false>._M_head_impl;
  if (__ptr_02._M_head_impl != (MessageReference *)0x0) {
    std::default_delete<discordpp::MessageReference>::operator()
              ((default_delete<discordpp::MessageReference> *)
               &(this->message_reference).super_field<discordpp::MessageReference>,
               __ptr_02._M_head_impl);
  }
  (this->message_reference).super_field<discordpp::MessageReference>.t_._M_t.
  super___uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
  ._M_t.
  super__Tuple_impl<0UL,_discordpp::MessageReference_*,_std::default_delete<discordpp::MessageReference>_>
  .super__Head_base<0UL,_discordpp::MessageReference_*,_false>._M_head_impl =
       (MessageReference *)0x0;
  _Var2._M_head_impl =
       (this->application_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var2._M_head_impl,8);
  }
  (this->application_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  std::unique_ptr<discordpp::Application,_std::default_delete<discordpp::Application>_>::~unique_ptr
            (&(this->application).super_field<discordpp::Application>.t_);
  __ptr_03._M_head_impl =
       (this->activity).super_field<discordpp::MessageActivity>.t_._M_t.
       super___uniq_ptr_impl<discordpp::MessageActivity,_std::default_delete<discordpp::MessageActivity>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::MessageActivity_*,_std::default_delete<discordpp::MessageActivity>_>
       .super__Head_base<0UL,_discordpp::MessageActivity_*,_false>._M_head_impl;
  if (__ptr_03._M_head_impl != (MessageActivity *)0x0) {
    std::default_delete<discordpp::MessageActivity>::operator()
              ((default_delete<discordpp::MessageActivity> *)
               &(this->activity).super_field<discordpp::MessageActivity>,__ptr_03._M_head_impl);
  }
  (this->activity).super_field<discordpp::MessageActivity>.t_._M_t.
  super___uniq_ptr_impl<discordpp::MessageActivity,_std::default_delete<discordpp::MessageActivity>_>
  ._M_t.
  super__Tuple_impl<0UL,_discordpp::MessageActivity_*,_std::default_delete<discordpp::MessageActivity>_>
  .super__Head_base<0UL,_discordpp::MessageActivity_*,_false>._M_head_impl = (MessageActivity *)0x0;
  _Var1._M_head_impl =
       (this->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl != (int *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  (this->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  _Var2._M_head_impl =
       (this->webhook_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var2._M_head_impl,8);
  }
  (this->webhook_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  _Var3._M_head_impl =
       (this->pinned).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (bool *)0x0) {
    operator_delete(_Var3._M_head_impl,1);
  }
  (this->pinned).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  __ptr_04._M_head_impl =
       (this->nonce).
       super_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super__Head_base<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl;
  if (__ptr_04._M_head_impl !=
      (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(this->nonce).
                     super_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,__ptr_04._M_head_impl);
  }
  (this->nonce).
  super_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .t_._M_t.
  super___uniq_ptr_impl<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  std::
  unique_ptr<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>,_std::default_delete<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>_>
  ::~unique_ptr(&(this->reactions).
                 super_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>
                 .t_);
  std::
  unique_ptr<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>,_std::default_delete<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>_>
  ::~unique_ptr(&(this->embeds).t_);
  std::
  unique_ptr<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>,_std::default_delete<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>_>
  ::~unique_ptr(&(this->attachments).t_);
  std::
  unique_ptr<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>,_std::default_delete<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>_>
  ::~unique_ptr(&(this->mention_channels).
                 super_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
                 .t_);
  __ptr_05._M_head_impl =
       (this->mention_roles).t_._M_t.
       super___uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
       .
       super__Head_base<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_false>
       ._M_head_impl;
  if (__ptr_05._M_head_impl !=
      (vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_> *)0x0) {
    std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::
    operator()((default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
                *)&this->mention_roles,__ptr_05._M_head_impl);
  }
  (this->mention_roles).t_._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_std::default_delete<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_*,_false>
  ._M_head_impl = (vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_> *)0x0;
  std::
  unique_ptr<std::vector<discordpp::User,_std::allocator<discordpp::User>_>,_std::default_delete<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>_>
  ::~unique_ptr(&(this->mentions).t_);
  _Var3._M_head_impl =
       (this->mention_everyone).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
       .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (bool *)0x0) {
    operator_delete(_Var3._M_head_impl,1);
  }
  (this->mention_everyone).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  _Var3._M_head_impl =
       (this->tts).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (bool *)0x0) {
    operator_delete(_Var3._M_head_impl,1);
  }
  (this->tts).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  _Var4._M_head_impl =
       (this->edited_timestamp).
       super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var4._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(this->edited_timestamp).
                     super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ,_Var4._M_head_impl);
  }
  (this->edited_timestamp).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_head_impl =
       (this->timestamp).t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var4._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->timestamp,_Var4._M_head_impl);
  }
  (this->timestamp).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_head_impl =
       (this->content).t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var4._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->content,_Var4._M_head_impl);
  }
  (this->content).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
            (&(this->author).t_);
  _Var2._M_head_impl =
       (this->channel_id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var2._M_head_impl,8);
  }
  (this->channel_id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  _Var5.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (this->id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>;
  if (_Var5.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl != (Snowflake *)0x0) {
    operator_delete((void *)_Var5.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,
                    8);
  }
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0;
  return;
}

Assistant:

Message(
        field<Snowflake> id = uninitialized,
        field<Snowflake> channel_id = uninitialized,
        field<User> author = uninitialized,
        field<std::string> content = uninitialized,
        field<Timestamp> timestamp = uninitialized,
        nullable_field<Timestamp> edited_timestamp = uninitialized,
        field<bool> tts = uninitialized,
        field<bool> mention_everyone = uninitialized,
        field<std::vector<User> > mentions = uninitialized,
        field<std::vector<Snowflake> > mention_roles = uninitialized,
        omittable_field<std::vector<ChannelMention> > mention_channels = omitted,
        field<std::vector<Attachment> > attachments = uninitialized,
        field<std::vector<Embed> > embeds = uninitialized,
        omittable_field<std::vector<Reaction> > reactions = omitted,
        omittable_field<std::variant<int, std::string> > nonce = omitted,
        field<bool> pinned = uninitialized,
        omittable_field<Snowflake> webhook_id = omitted,
        field<int> type = uninitialized,
        omittable_field<MessageActivity> activity = omitted,
        omittable_field<Application> application = omitted,
        omittable_field<Snowflake> application_id = omitted,
        omittable_field<MessageReference> message_reference = omitted,
        omittable_field<int> flags = omitted,
        nullable_omittable_field<Message> referenced_message = omitted,
        omittable_field<MessageInteraction> interaction = omitted,
        omittable_field<Channel> thread = omitted,
        omittable_field<std::vector<Component> > components = omitted,
        omittable_field<std::vector<StickerItem> > sticker_items = omitted,
        omittable_field<std::vector<Sticker> > stickers = omitted,
        omittable_field<int> position = omitted,
        omittable_field<RoleSubscriptionData> role_subscription_data = omitted
    ):
        id(id),
        channel_id(channel_id),
        author(author),
        content(content),
        timestamp(timestamp),
        edited_timestamp(edited_timestamp),
        tts(tts),
        mention_everyone(mention_everyone),
        mentions(mentions),
        mention_roles(mention_roles),
        mention_channels(mention_channels),
        attachments(attachments),
        embeds(embeds),
        reactions(reactions),
        nonce(nonce),
        pinned(pinned),
        webhook_id(webhook_id),
        type(type),
        activity(activity),
        application(application),
        application_id(application_id),
        message_reference(message_reference),
        flags(flags),
        referenced_message(referenced_message),
        interaction(interaction),
        thread(thread),
        components(components),
        sticker_items(sticker_items),
        stickers(stickers),
        position(position),
        role_subscription_data(role_subscription_data)
    {}